

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<216u,Fixpp::Type::Int>,Fixpp::TagT<217u,Fixpp::Type::String>>>>
::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)66>,Fixpp::TagT<42u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<61u,Fixpp::Type::Char>,Fixpp::Required<Fixpp::TagT<148u,Fixpp::Type::String>>,Fixpp::TagT<358u,Fixpp::Type::Int>,Fixpp::TagT<359u,Fixpp::Type::Data>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<215u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<216u,Fixpp::Type::Int>,Fixpp::TagT<217u,Fixpp::Type::String>>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<146u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<46u,Fixpp::Type::String>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<216u,Fixpp::Type::Int>,Fixpp::TagT<217u,Fixpp::Type::String>>>>
           *this,Field *field,ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_B_>,_Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<61U,_Fixpp::Type::Char>,_Fixpp::Required<Fixpp::TagT<148U,_Fixpp::Type::String>_>,_Fixpp::TagT<358U,_Fixpp::Type::Int>,_Fixpp::TagT<359U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
          *tagSet,bool strict,bool skipUnknown)

{
  StreamCursor *this_00;
  StreamBuf<char> *pSVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  undefined7 extraout_var;
  long lVar7;
  long lVar8;
  char *pcVar9;
  Type type;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  uint unaff_R12D;
  uint uVar13;
  int iVar14;
  int unaff_R14D;
  byte *pbVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auStack_1f8 [8];
  GroupType groupRef;
  undefined1 auStack_b8 [8];
  GroupSet groupSet;
  undefined1 local_90 [8];
  Visitor visitor;
  
  this_00 = context->cursor;
  pSVar1 = this_00->buf;
  if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
     (lVar5 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar5 == 0)) {
    bVar16 = false;
  }
  else {
    pSVar1 = this_00->buf;
    pbVar15 = *(byte **)&pSVar1->field_0x10;
    lVar5 = *(long *)&pSVar1->field_0x18 - (long)pbVar15;
    if (lVar5 == 0) {
      lVar5 = (**(code **)(*(long *)pSVar1 + 0x38))();
    }
    sVar10 = 0;
    unaff_R14D = 0;
    do {
      if ((byte)(*pbVar15 - 0x30) < 10) {
        unaff_R14D = (uint)*pbVar15 + unaff_R14D * 10 + -0x30;
        sVar10 = sVar10 + 1;
        lVar5 = lVar5 + -1;
        bVar16 = lVar5 != 0;
      }
      else {
        bVar16 = false;
      }
      pbVar15 = pbVar15 + 1;
    } while (bVar16);
    bVar16 = sVar10 != 0;
    if (bVar16) {
      StreamCursor::advance(this_00,sVar10);
      bVar16 = true;
    }
  }
  if (!bVar16) {
    pSVar1 = this_00->buf;
    if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
       (lVar5 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar5 == 0)) {
      uVar12 = 0x3f;
    }
    else {
      pSVar1 = this_00->buf;
      if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
        cVar4 = **(char **)&pSVar1->field_0x10;
      }
      else {
        cVar4 = (**(code **)(*(long *)pSVar1 + 0x48))();
      }
      uVar12 = (ulong)(uint)(int)cVar4;
    }
    ParsingContext::setError
              (context,ParsingError,
               "Could not parse instances number in RepeatingGroup %d, expected int, got \'%c\'",
               0xd7,uVar12);
    return;
  }
  bVar16 = StreamCursor::advance(this_00,1);
  if (unaff_R14D == 0) {
    if (!bVar16) {
      pcVar9 = "Got early EOF after tag %d value";
      goto LAB_009063b0;
    }
  }
  else {
    if (!bVar16) {
      pcVar9 = "Expected RepeatingGroup %d, got EOF";
LAB_009063b0:
      ParsingContext::setError(context,Incomplete,pcVar9,0xd7);
      return;
    }
    if ((ulong)(((long)(field->values).
                       super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>_>
                       .
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_void>
                       .super_SmallVectorBase.CapacityX -
                 (long)(field->values).
                       super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>_>
                       .
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_void>
                       .super_SmallVectorBase.BeginX >> 3) * 0x6f96f96f96f96f97) <
        (ulong)(long)unaff_R14D) {
      llvm::
      SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_false>
      ::grow((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_false>
              *)field,(long)unaff_R14D);
    }
    groupSet.bits.super__Base_bitset<4UL>._M_w[1] = 0;
    groupSet.bits.super__Base_bitset<4UL>._M_w[2] = 0;
    auStack_b8 = (undefined1  [8])0x0;
    groupSet.bits.super__Base_bitset<4UL>._M_w[0] = 0;
    bVar16 = true;
    do {
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
      .allBits.super__Base_bitset<1UL>._M_w =
           (_Base_bitset<1UL>)
           ((long)&groupRef.
                   super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                   .unparsed.
                   super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
                   .
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                   .
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
                   .super_SmallVectorBase + 0x10);
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
      .values.base.
      super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<216U,_Fixpp::Type::Int>_>,_false>.value.
      m_view.second = 0;
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
      .values.base.
      super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<217U,_Fixpp::Type::String>_>,_false>.value.
      m_view.first = (char *)0x0;
      auStack_1f8 = (undefined1  [8])0x0;
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
      .values.base.
      super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<216U,_Fixpp::Type::Int>_>,_false>.value.
      m_view.first = (char *)0x0;
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
      ._32_8_ = 0;
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
      .unparsed.
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
      .
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
      .super_SmallVectorBase.EndX =
           (void *)((long)groupRef.
                          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                          .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer +
                   0x10);
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
      .unparsed.
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
      .
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
      .super_SmallVectorBase.BeginX =
           (void *)groupRef.
                   super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                   .allBits.super__Base_bitset<1UL>._M_w;
      bVar3 = bVar16;
      do {
        pSVar1 = this_00->buf;
        uVar2 = *(undefined8 *)&pSVar1->field_0x8;
        lVar5 = *(long *)&pSVar1->field_0x10;
        visitor._24_8_ = *(undefined8 *)&pSVar1->field_0x18;
        if ((visitor._24_8_ == lVar5) &&
           (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 == 0)) {
          bVar17 = false;
          lVar6 = 0;
        }
        else {
          pSVar1 = this_00->buf;
          pbVar15 = *(byte **)&pSVar1->field_0x10;
          lVar6 = *(long *)&pSVar1->field_0x18 - (long)pbVar15;
          if (lVar6 == 0) {
            lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))();
          }
          sVar10 = 0;
          uVar13 = 0;
          do {
            if ((byte)(*pbVar15 - 0x30) < 10) {
              uVar13 = ((uint)*pbVar15 + uVar13 * 10) - 0x30;
              sVar10 = sVar10 + 1;
              lVar6 = lVar6 + -1;
              bVar16 = lVar6 != 0;
            }
            else {
              bVar16 = false;
            }
            pbVar15 = pbVar15 + 1;
          } while (bVar16);
          bVar17 = sVar10 != 0;
          if (bVar17) {
            bVar17 = true;
            bVar16 = StreamCursor::advance(this_00,sVar10);
            lVar6 = CONCAT71(extraout_var,bVar16);
            unaff_R12D = uVar13;
          }
        }
        bVar16 = bVar3;
        if (bVar17) {
          lVar8 = 1;
          lVar7 = 0;
          do {
            if (lVar8 < lVar7) {
              lVar11 = -1;
              break;
            }
            lVar11 = (lVar8 + lVar7) / 2;
            uVar13 = details::
                     IndexesImpl<meta::pack::Pack<Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>
                     ::Sorted.arr[lVar11];
            if (uVar13 != unaff_R12D) {
              if ((int)uVar13 < (int)unaff_R12D) {
                lVar7 = lVar11 + 1;
                lVar11 = lVar6;
              }
              else {
                lVar8 = lVar11 + -1;
                lVar11 = lVar6;
              }
            }
            lVar6 = lVar11;
          } while (uVar13 != unaff_R12D);
          if (lVar11 == -1) {
            lVar8 = 10;
            lVar7 = 0;
            lVar6 = -1;
            do {
              if (lVar8 < lVar7) {
                lVar11 = -1;
                break;
              }
              lVar11 = (lVar8 + lVar7) / 2;
              uVar13 = details::
                       IndexesImpl<meta::pack::Pack<Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<61U,_Fixpp::Type::Char>,_Fixpp::Required<Fixpp::TagT<148U,_Fixpp::Type::String>_>,_Fixpp::TagT<358U,_Fixpp::Type::Int>,_Fixpp::TagT<359U,_Fixpp::Type::Data>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
                       ::Sorted.arr[lVar11];
              if (uVar13 != unaff_R12D) {
                if ((int)uVar13 < (int)unaff_R12D) {
                  lVar7 = lVar11 + 1;
                  lVar11 = lVar6;
                }
                else {
                  lVar8 = lVar11 + -1;
                  lVar11 = lVar6;
                }
              }
              lVar6 = lVar11;
            } while (uVar13 != unaff_R12D);
            iVar14 = 10;
            bVar17 = true;
            bVar16 = false;
            if ((lVar11 == -1) && (bVar16 = false, unaff_R12D != 10)) {
              bVar16 = StreamCursor::advance(this_00,1);
              pcVar9 = "Expected value after tag %d, got EOF";
              if (!bVar16) goto LAB_00906175;
              lVar6 = *(long *)&this_00->buf->field_0x8;
              lVar8 = *(long *)&this_00->buf->field_0x10;
              while( true ) {
                pSVar1 = this_00->buf;
                if (*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) {
                  lVar7 = (**(code **)(*(long *)pSVar1 + 0x38))();
                  bVar16 = lVar7 == 0;
                }
                else {
                  bVar16 = false;
                }
                iVar14 = 1;
                if (bVar16) {
                  type = ParsingError;
                  pcVar9 = "Expected value after tag %d, got EOF";
                  goto LAB_009061bc;
                }
                pSVar1 = this_00->buf;
                if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
                  cVar4 = **(char **)&pSVar1->field_0x10;
                }
                else {
                  cVar4 = (**(code **)(*(long *)pSVar1 + 0x48))();
                }
                if (cVar4 == '|') break;
                StreamCursor::advance(this_00,1);
              }
              if (strict) {
                bVar17 = false;
                ParsingContext::setError
                          (context,UnknownTag,"Encountered unknown tag %d in RepeatingGroup %d",
                           (ulong)unaff_R12D,0xd7);
                bVar16 = bVar3;
              }
              else {
                if (!skipUnknown) {
                  lVar7 = *(long *)&this_00->buf->field_0x10;
                  lVar11 = *(long *)&this_00->buf->field_0x8;
                  if (groupRef.
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                      .unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
                      .
                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                      .
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
                      .super_SmallVectorBase.EndX <=
                      groupRef.
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                      .unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
                      .
                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                      .
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
                      .super_SmallVectorBase.BeginX) {
                    llvm::
                    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                    ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                            *)&groupRef.
                               super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                               .allBits,0);
                  }
                  *(uint *)groupRef.
                           super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                           .unparsed.
                           super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
                           .
                           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                           .
                           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
                           .super_SmallVectorBase.BeginX = unaff_R12D;
                  *(long *)((long)groupRef.
                                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                                  .unparsed.
                                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
                                  .
                                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                                  .
                                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
                                  .super_SmallVectorBase.BeginX + 8) = lVar8;
                  *(long *)((long)groupRef.
                                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                                  .unparsed.
                                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
                                  .
                                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                                  .
                                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
                                  .super_SmallVectorBase.BeginX + 0x10) =
                       (lVar6 + lVar7) - (lVar11 + lVar8);
                  groupRef.
                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                  .unparsed.
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
                  .
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
                  .super_SmallVectorBase.BeginX =
                       (void *)((long)groupRef.
                                      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                                      .unparsed.
                                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
                                      .
                                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                                      .
                                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
                                      .super_SmallVectorBase.BeginX + 0x18);
                }
                bVar16 = StreamCursor::advance(this_00,1);
                type = Incomplete;
                if (bVar16) {
                  iVar14 = 0xb;
                  goto LAB_009060c2;
                }
                pcVar9 = "Got early EOF after tag %d value";
LAB_009061bc:
                bVar17 = false;
                ParsingContext::setError(context,type,pcVar9,(ulong)unaff_R12D);
                bVar16 = bVar3;
              }
            }
          }
          else {
            bVar17 = std::bitset<218UL>::test((bitset<218UL> *)auStack_b8,(ulong)unaff_R12D);
            if (bVar17) {
              iVar14 = 10;
              bVar17 = true;
            }
            else {
              bVar16 = StreamCursor::advance(this_00,1);
              pcVar9 = "Expected value after Tag %d, got EOF";
              if (bVar16) {
                TagSet<Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                ::set((TagSet<Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                       *)auStack_b8,unaff_R12D);
                local_90[0] = '\0';
                visitor.context = (ParsingContext *)auStack_b8;
                visitor._0_8_ = context;
                visitor.groupSet._0_1_ = strict;
                visitor.groupSet._1_1_ = skipUnknown;
                doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<216u,Fixpp::Type::Int>,Fixpp::TagT<217u,Fixpp::Type::String>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<216u,Fixpp::Type::Int>,Fixpp::TagT<217u,Fixpp::Type::String>>>>::Visitor,0ul,1ul>
                          (auStack_1f8,unaff_R12D,local_90);
                iVar14 = 0;
                if ((local_90[0] == '\0') && (bVar16 = StreamCursor::advance(this_00,1), !bVar16)) {
                  iVar14 = 1;
                  ParsingContext::setError
                            (context,Incomplete,"Got early EOF in RepeatingGroup %d",0xd7);
                }
LAB_009060c2:
                bVar17 = false;
                bVar16 = bVar3;
              }
              else {
LAB_00906175:
                iVar14 = 1;
                bVar17 = false;
                ParsingContext::setError(context,Incomplete,pcVar9,(ulong)unaff_R12D);
                bVar16 = bVar3;
              }
            }
          }
        }
        else {
          pSVar1 = this_00->buf;
          if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
             (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 == 0)) {
            cVar4 = '?';
          }
          else {
            pSVar1 = this_00->buf;
            if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
              cVar4 = **(char **)&pSVar1->field_0x10;
            }
            else {
              cVar4 = (**(code **)(*(long *)pSVar1 + 0x48))();
            }
          }
          iVar14 = 1;
          bVar17 = true;
          ParsingContext::setError
                    (context,ParsingError,
                     "Could not parse tag in RepeatingGroup %d, expected int, got \'%c\'",0xd7,
                     (ulong)(uint)(int)cVar4);
        }
        if (bVar17) {
          pSVar1 = this_00->buf;
          *(undefined8 *)&pSVar1->field_0x8 = uVar2;
          *(long *)&pSVar1->field_0x10 = lVar5;
          pSVar1->field_0x18 = visitor.strict;
          pSVar1->field_0x19 = visitor.skipUnknown;
          *(undefined6 *)&pSVar1->field_0x1a = visitor._26_6_;
        }
        bVar3 = bVar16;
      } while ((iVar14 == 0) || (iVar14 == 0xb));
      if (iVar14 == 10) {
        llvm::
        SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_false>
        ::push_back((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_false>
                     *)field,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>
                              *)auStack_1f8);
        groupSet.bits.super__Base_bitset<4UL>._M_w[1] = 0;
        groupSet.bits.super__Base_bitset<4UL>._M_w[2] = 0;
        auStack_b8 = (undefined1  [8])0x0;
        groupSet.bits.super__Base_bitset<4UL>._M_w[0] = 0;
      }
      if (groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
          .allBits.super__Base_bitset<1UL>._M_w !=
          (_Base_bitset<1UL>)
          ((long)&groupRef.
                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                  .unparsed.
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed>
                  .
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>::Unparsed,_void>
                  .super_SmallVectorBase + 0x10U)) {
        free((void *)groupRef.
                     super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>
                     .allBits.super__Base_bitset<1UL>._M_w);
      }
    } while ((iVar14 == 10) && (bVar16));
  }
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool strict, bool skipUnknown)
            {
                auto& cursor = context.cursor;

                int instances;
                TRY_MATCH_INT(
                    instances,
                    "Could not parse instances number in RepeatingGroup %d, expected int, got '%c'",
                     GroupTag::Id, CURSOR_CURRENT(cursor)
                );

                if (!instances)
                {
                    TRY_ADVANCE("Got early EOF after tag %d value", GroupTag::Id);
                    return;
                }

                // Literal('=')
                TRY_ADVANCE("Expected RepeatingGroup %d, got EOF", GroupTag::Id);

                field.reserve(instances);

                GroupSet groupSet;

                int tag;
                bool inGroup = true;

                do
                {
                    typename Field::GroupType groupRef;

                    for (;;)
                    {

                        StreamCursor::Revert revertTag(cursor);
                        TRY_MATCH_INT(
                            tag,
                            "Could not parse tag in RepeatingGroup %d, expected int, got '%c'",
                            GroupTag::Id, CURSOR_CURRENT(cursor)
                        );

                        // The tag we just encountered is invalid for the RepeatingGroup
                        if (!groupSet.valid(tag))
                        {
                            // If it's not valid for the Message either, we consider it to be
                            // a custom tag
                            if (!tagSet.valid(tag) && tag != 10)
                            {
                                revertTag.ignore();
                                TRY_ADVANCE("Expected value after tag %d, got EOF", tag);

                                StreamCursor::Token valueToken(cursor);
                                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                                if (!strict)
                                {
                                    if (!skipUnknown)
                                        groupRef.unparsed.emplace_back(tag, valueToken.view());
                                    TRY_ADVANCE("Got early EOF after tag %d value", tag);
                                    continue;
                                }
                                else if (strict)
                                {
                                    context.setError(ErrorKind::UnknownTag, "Encountered unknown tag %d in RepeatingGroup %d", tag, GroupTag::Id);
                                    return;
                                }
                            }

                            inGroup = false;
                            break;
                        }

                        // The tag is already set in our GroupSet, we finished parsing the current instance
                        if (groupSet.test(tag))
                            break;

                        revertTag.ignore();

                        // Literal('=')
                        TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                        groupSet.set(tag);

                        Visitor visitor(context, groupSet, strict, skipUnknown);

                        // Invariant: here visitField should ALWAYS return true as we are checking if the tag
                        // is valid prior to the call
                        //
                        // TODO: enfore the invariant ?
                        visitField(groupRef, tag, visitor);

                        // If we are in a recursive RepeatingGroup parsing, we must *NOT* advance the cursor
                        if (!visitor.recursive)
                            TRY_ADVANCE("Got early EOF in RepeatingGroup %d", GroupTag::Id);
                    }

                    field.add(std::move(groupRef));
                    groupSet.reset();

                } while (inGroup);

            }